

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O1

Formula * __thiscall
FMB::FiniteModelMultiSorted::partialEvaluate(FiniteModelMultiSorted *this,Formula *formula)

{
  Term *this_00;
  long lVar1;
  Connective CVar2;
  undefined4 uVar3;
  bool bVar4;
  uint uVar5;
  Formula *pFVar6;
  Formula *pFVar7;
  Formula *pFVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long *plVar11;
  long *plVar12;
  undefined8 *puVar13;
  long *local_90;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar8 = formula;
  switch(formula->_connective) {
  case LITERAL:
    this_00 = *(Term **)(formula + 1);
    uVar5 = Kernel::Term::numVarOccs(this_00);
    if (uVar5 == 0) {
      bVar4 = evaluateGroundLiteral(this,(Literal *)this_00);
      if (bVar4) {
        pFVar8 = Kernel::Formula::trueFormula();
        return pFVar8;
      }
      pFVar8 = Kernel::Formula::falseFormula();
      return pFVar8;
    }
    break;
  case AND:
  case OR:
    puVar10 = *(undefined8 **)(formula + 1);
    if (puVar10 == (undefined8 *)0x0) {
      puVar9 = (undefined8 *)0x0;
    }
    else {
      puVar13 = (undefined8 *)0x0;
      do {
        pFVar8 = (Formula *)*puVar10;
        puVar10 = (undefined8 *)puVar10[1];
        pFVar8 = partialEvaluate(this,pFVar8);
        puVar9 = (undefined8 *)
                 ::Lib::FixedSizeAllocator<16UL>::alloc
                           ((FixedSizeAllocator<16UL> *)
                            (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
        *puVar9 = pFVar8;
        puVar9[1] = puVar13;
        puVar13 = puVar9;
      } while (puVar10 != (undefined8 *)0x0);
    }
    pFVar8 = (Formula *)
             ::Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    pFVar8->_connective = formula->_connective;
    (pFVar8->_label)._M_dataplus._M_p = (pointer)&(pFVar8->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar8->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(undefined8 **)(pFVar8 + 1) = puVar9;
    break;
  case IMP:
  case IFF:
  case XOR:
    pFVar8 = (Formula *)formula[1]._label._M_dataplus._M_p;
    pFVar7 = partialEvaluate(this,*(Formula **)(formula + 1));
    pFVar6 = partialEvaluate(this,pFVar8);
    pFVar8 = (Formula *)
             ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    pFVar8->_connective = formula->_connective;
    (pFVar8->_label)._M_dataplus._M_p = (pointer)&(pFVar8->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar8->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Formula **)(pFVar8 + 1) = pFVar7;
    pFVar8[1]._label._M_dataplus._M_p = (pointer)pFVar6;
    break;
  case NOT:
    pFVar7 = partialEvaluate(this,*(Formula **)(formula + 1));
    pFVar8 = (Formula *)
             ::Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    pFVar8->_connective = NOT;
    (pFVar8->_label)._M_dataplus._M_p = (pointer)&(pFVar8->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar8->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Formula **)(pFVar8 + 1) = pFVar7;
    break;
  case FORALL:
  case EXISTS:
    CVar2 = formula[1]._connective;
    uVar3 = *(undefined4 *)&formula[1].field_0x4;
    pFVar7 = partialEvaluate(this,(Formula *)formula[1]._label._M_string_length);
    pFVar8 = (Formula *)
             ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    pFVar8->_connective = formula->_connective;
    (pFVar8->_label)._M_dataplus._M_p = (pointer)&(pFVar8->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar8->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    pFVar8[1]._connective = CVar2;
    *(undefined4 *)&pFVar8[1].field_0x4 = uVar3;
    pFVar8[1]._label._M_dataplus._M_p = (pointer)0x0;
    pFVar8[1]._label._M_string_length = (size_type)pFVar7;
    break;
  default:
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x50);
    Kernel::Formula::toString_abi_cxx11_(&local_70,formula);
    std::operator+(&local_50,"Cannot evaluate ",&local_70);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar11;
    plVar12 = plVar11 + 2;
    if (local_90 == plVar12) {
      local_80 = *plVar12;
      uStack_78 = (undefined4)plVar11[3];
      uStack_74 = *(undefined4 *)((long)plVar11 + 0x1c);
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar12;
    }
    lVar1 = plVar11[1];
    *plVar11 = (long)plVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    *puVar10 = &PTR_cry_00b69f40;
    puVar10[1] = puVar10 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar10 + 1),local_90,lVar1 + (long)local_90);
    *puVar10 = &PTR_cry_00b6a028;
    *(undefined4 *)(puVar10 + 5) = 0;
    puVar10[6] = puVar10 + 8;
    puVar10[7] = 0;
    *(undefined1 *)(puVar10 + 8) = 0;
    __cxa_throw(puVar10,&::Lib::UserErrorException::typeinfo,
                ::Lib::UserErrorException::~UserErrorException);
  case FALSE:
  case TRUE:
    break;
  }
  return pFVar8;
}

Assistant:

Formula* FiniteModelMultiSorted::partialEvaluate(Formula* formula)
    {
#if DEBUG_MODEL
        for(unsigned i=0;i<depth;i++){ cout << "."; }
        cout << "Evaluating..." << formula->toString() << endl;
#endif
        
        switch(formula->connective()){
                case LITERAL:
            {
                Literal* lit = formula->literal();
                if(!lit->ground()){
                    return formula;
                }
                bool evaluated = evaluateGroundLiteral(lit);
                return evaluated ? Formula::trueFormula() : Formula::falseFormula(); 
            }
                
                case FALSE:
                case TRUE:
                    return formula;
                case NOT:
                {
                  Formula* inner = partialEvaluate(formula->uarg());
                  return new NegatedFormula(inner);
                }
                case AND:
                case OR:
            {
                FormulaList* args = formula->args();
                FormulaList* newArgs = 0;
                FormulaList::Iterator fit(args);
                while(fit.hasNext()){
                    Formula* newArg = partialEvaluate(fit.next());
                    FormulaList::push(newArg,newArgs);
                }
                return new JunctionFormula(formula->connective(),newArgs); 
            }
                
                case IMP:
                case XOR:
                case IFF:
            {
                Formula* left = formula->left();
                Formula* right = formula->right();
                Formula* newLeft = partialEvaluate(left);
                Formula* newRight = partialEvaluate(right);
                
                return new BinaryFormula(formula->connective(),newLeft,newRight); 
            }
                
                case FORALL:
                case EXISTS:
            {
                VList* vs = formula->vars();
                Formula* inner  = formula->qarg();
                Formula* newInner = partialEvaluate(inner);
                return new QuantifiedFormula(formula->connective(),vs,0,newInner);
            }
            default:
                USER_ERROR("Cannot evaluate " + formula->toString() + ", not supported");
        }

        NOT_IMPLEMENTED;
        return 0;
    }